

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::testAndParseUri(Parser *this,QString *uri)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  QString local_68;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->index;
  if (((this->symbols).d.size <= (long)iVar1) || ((this->symbols).d.ptr[iVar1].token != FUNCTION)) {
    bVar2 = false;
    goto LAB_005f04ca;
  }
  this->index = iVar1 + 1;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  bVar2 = parseFunction(this,&local_48,&local_68);
  if (bVar2) {
    QVar5.m_data = (char *)0x3;
    QVar5.m_size = (qsizetype)&local_48;
    iVar4 = QString::compare(QVar5,0x6d4842);
    if (iVar4 != 0) goto LAB_005f047c;
    QString::operator=(uri,&local_68);
    cVar3 = QString::startsWith((QChar)(char16_t)uri,0x27);
    if (cVar3 == '\0') {
      cVar3 = QString::startsWith((QChar)(char16_t)uri,0x22);
      bVar2 = true;
      if (cVar3 != '\0') goto LAB_005f0525;
    }
    else {
LAB_005f0525:
      QString::remove((longlong)uri,0);
      QString::chop((longlong)uri);
      bVar2 = true;
    }
  }
  else {
LAB_005f047c:
    this->index = iVar1;
    bVar2 = false;
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_005f04ca:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::testAndParseUri(QString *uri)
{
    const int rewind = index;
    if (!testFunction()) return false;

    QString name, args;
    if (!parseFunction(&name, &args)) {
        index = rewind;
        return false;
    }
    if (name.compare("url"_L1, Qt::CaseInsensitive) != 0) {
        index = rewind;
        return false;
    }
    *uri = args;
    removeOptionalQuotes(uri);
    return true;
}